

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

ssize_t __thiscall
ezc3d::ParametersNS::GroupNS::Group::read(Group *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  streamoff sVar2;
  int in_R8D;
  int nbCharInDesc;
  int nextParamByteInFile;
  size_t offsetNext;
  seekdir *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  fstream *in_stack_ffffffffffffff80;
  PROCESSOR_TYPE in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined1 local_68 [16];
  uint local_54;
  size_t local_50;
  string local_48 [8];
  seekdir *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  fstream *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  if (in_R8D < 0) {
    this->_isLocked = true;
  }
  else {
    this->_isLocked = false;
  }
  ezc3d::c3d::readString_abi_cxx11_
            ((c3d *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::assign((string *)this);
  std::__cxx11::string::~string(local_48);
  Parameters::processorType((Parameters *)__buf);
  local_50 = ezc3d::c3d::readUint
                       ((c3d *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,
                        in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                        in_stack_ffffffffffffff70);
  if (local_50 == 0) {
    local_54 = 0;
  }
  else {
    local_68 = std::istream::tellg();
    sVar2 = std::fpos::operator_cast_to_long((fpos *)local_68);
    local_54 = ((int)sVar2 + (int)local_50) - 2;
  }
  Parameters::processorType((Parameters *)__buf);
  iVar1 = ezc3d::c3d::readInt((c3d *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                              in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,
                              in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                              in_stack_ffffffffffffff70);
  if (iVar1 != 0) {
    ezc3d::c3d::readString_abi_cxx11_
              ((c3d *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::__cxx11::string::operator=
              ((string *)&this->_description,(string *)&stack0xffffffffffffff70);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  }
  return (ulong)local_54;
}

Assistant:

int ezc3d::ParametersNS::GroupNS::Group::read(
    ezc3d::c3d &c3d, const ezc3d::ParametersNS::Parameters &params,
    std::fstream &file, int nbCharInName) {
  if (nbCharInName < 0)
    _isLocked = true;
  else
    _isLocked = false;

  // Read name of the group
  _name.assign(c3d.readString(
      file,
      static_cast<unsigned int>(abs(nbCharInName) * ezc3d::DATA_TYPE::BYTE)));

  // number of byte to the next group from here
  size_t offsetNext(
      c3d.readUint(params.processorType(), file, 2 * ezc3d::DATA_TYPE::BYTE));
  // Compute the position of the element in the file
  int nextParamByteInFile;
  if (offsetNext == 0)
    nextParamByteInFile = 0;
  else
    nextParamByteInFile = static_cast<int>(static_cast<size_t>(file.tellg()) +
                                           offsetNext - ezc3d::DATA_TYPE::WORD);

  // Byte 5+nbCharInName ==> Number of characters in group description
  int nbCharInDesc(
      c3d.readInt(params.processorType(), file, 1 * ezc3d::DATA_TYPE::BYTE));
  // Byte 6+nbCharInName ==> Group description
  if (nbCharInDesc)
    _description =
        c3d.readString(file, static_cast<unsigned int>(nbCharInDesc));

  // Return how many bytes
  return nextParamByteInFile;
}